

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imglsadf.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  ostream *poVar8;
  long lVar9;
  bool bVar10;
  istream *input_stream;
  char *pcVar11;
  allocator local_84d;
  int interpolation_period;
  int frame_period;
  int num_stage;
  int num_filter_order;
  int num_pade_order;
  char **local_838;
  undefined4 local_82c;
  double alpha;
  string local_820;
  double signal;
  double local_7f8;
  vector<double,_std::allocator<double>_> filter_coefficients;
  Buffer buffer;
  InputSourceFromStream input_source;
  ostringstream error_message_10;
  InputSourcePreprocessingForMelCepstrum preprocessing;
  ifstream ifs2;
  byte abStack_500 [488];
  ifstream ifs1;
  byte abStack_2f8 [488];
  InverseMglsaDigitalFilter filter;
  InputSourceInterpolation interpolation;
  
  num_filter_order = 0x19;
  num_stage = 0;
  alpha = 0.35;
  frame_period = 100;
  interpolation_period = 1;
  num_pade_order = 4;
  local_82c = 0;
  local_838 = argv;
  bVar3 = true;
switchD_00103710_caseD_6b:
  bVar10 = bVar3;
  iVar7 = ya_getopt_long(argc,argv,"m:a:c:p:i:P:tkh",(option *)0x0,(int *)0x0);
  if (iVar7 - 0x61U < 0x14) {
    bVar3 = false;
    switch(iVar7) {
    case 0x61:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar3 = sptk::ConvertStringToDouble((string *)&ifs1,&alpha);
      if (bVar3) {
        bVar4 = sptk::IsValidAlpha(alpha);
        std::__cxx11::string::~string((string *)&ifs1);
        bVar3 = bVar10;
        if (bVar4) goto switchD_00103710_caseD_6b;
      }
      else {
        std::__cxx11::string::~string((string *)&ifs1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
      std::operator<<((ostream *)&ifs1,"The argument for the -a option must be in (-1.0, 1.0)");
      std::__cxx11::string::string((string *)&ifs2,"imglsadf",(allocator *)&error_message_10);
      sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
      break;
    default:
      goto switchD_00103710_caseD_62;
    case 99:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs1,&num_stage);
      bVar5 = -1 < num_stage;
      std::__cxx11::string::~string((string *)&ifs1);
      argv = local_838;
      bVar3 = bVar10;
      if (bVar4 && bVar5) goto switchD_00103710_caseD_6b;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
      poVar8 = std::operator<<((ostream *)&ifs1,"The argument for the -c option must be a ");
      std::operator<<(poVar8,"non-negative integer");
      std::__cxx11::string::string((string *)&ifs2,"imglsadf",(allocator *)&error_message_10);
      sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
      break;
    case 0x68:
      anon_unknown.dwarf_2f6d::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs1,&interpolation_period);
      bVar5 = -1 < interpolation_period;
      std::__cxx11::string::~string((string *)&ifs1);
      argv = local_838;
      bVar3 = bVar10;
      if (bVar4 && bVar5) goto switchD_00103710_caseD_6b;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
      poVar8 = std::operator<<((ostream *)&ifs1,"The argument for the -i option must be a ");
      std::operator<<(poVar8,"non-negative integer");
      std::__cxx11::string::string((string *)&ifs2,"imglsadf",(allocator *)&error_message_10);
      sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
      break;
    case 0x6b:
      goto switchD_00103710_caseD_6b;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs1,&num_filter_order);
      bVar5 = -1 < num_filter_order;
      std::__cxx11::string::~string((string *)&ifs1);
      argv = local_838;
      bVar3 = bVar10;
      if (bVar4 && bVar5) goto switchD_00103710_caseD_6b;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
      poVar8 = std::operator<<((ostream *)&ifs1,"The argument for the -m option must be a ");
      std::operator<<(poVar8,"non-negative integer");
      std::__cxx11::string::string((string *)&ifs2,"imglsadf",(allocator *)&error_message_10);
      sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
      break;
    case 0x70:
      std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
      bVar5 = sptk::ConvertStringToInteger((string *)&ifs1,&frame_period);
      bVar4 = 0 < frame_period;
      std::__cxx11::string::~string((string *)&ifs1);
      argv = local_838;
      bVar3 = bVar10;
      if (bVar5 && bVar4) goto switchD_00103710_caseD_6b;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
      std::operator<<((ostream *)&ifs1,"The argument for the -p option must be a positive integer");
      std::__cxx11::string::string((string *)&ifs2,"imglsadf",(allocator *)&error_message_10);
      sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
      break;
    case 0x74:
      local_82c = (undefined4)
                  CONCAT71((int7)((ulong)((long)&switchD_00103710::switchdataD_0010d018 +
                                         (long)(int)(&switchD_00103710::switchdataD_0010d018)
                                                    [iVar7 - 0x61U]) >> 8),1);
      bVar3 = bVar10;
      goto switchD_00103710_caseD_6b;
    }
  }
  else if (iVar7 == 0x50) {
    std::__cxx11::string::string((string *)&ifs1,ya_optarg,(allocator *)&ifs2);
    bVar3 = sptk::ConvertStringToInteger((string *)&ifs1,&num_pade_order);
    if (bVar3) {
      bVar4 = sptk::IsInRange(num_pade_order,4,7);
      std::__cxx11::string::~string((string *)&ifs1);
      bVar3 = bVar10;
      if (bVar4) goto switchD_00103710_caseD_6b;
    }
    else {
      std::__cxx11::string::~string((string *)&ifs1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
    poVar8 = std::operator<<((ostream *)&ifs1,"The argument for the -P option must be an integer ");
    poVar8 = std::operator<<(poVar8,"in the range of ");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,4);
    poVar8 = std::operator<<(poVar8," to ");
    std::ostream::operator<<((ostream *)poVar8,7);
    std::__cxx11::string::string((string *)&ifs2,"imglsadf",(allocator *)&error_message_10);
    sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
  }
  else {
    if (iVar7 != -1) goto switchD_00103710_caseD_62;
    if (frame_period / 2 < interpolation_period) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
      poVar8 = std::operator<<((ostream *)&ifs1,
                               "Interpolation period must be equal to or less than half ");
      std::operator<<(poVar8,"frame period");
      std::__cxx11::string::string((string *)&ifs2,"imglsadf",(allocator *)&error_message_10);
      sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
      goto LAB_00103c29;
    }
    lVar9 = (long)argc;
    if (argc - ya_optind == 1) {
      lVar2 = lVar9 + -1;
      pcVar11 = (char *)0x0;
    }
    else {
      if (argc - ya_optind != 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
        std::operator<<((ostream *)&ifs1,"Just two input files, mgcfile and infile, are required");
        std::__cxx11::string::string((string *)&ifs2,"imglsadf",(allocator *)&error_message_10);
        sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
        goto LAB_00103c29;
      }
      lVar2 = lVar9 + -2;
      pcVar11 = argv[lVar9 + -1];
    }
    pcVar1 = argv[lVar2];
    bVar3 = sptk::SetBinaryMode();
    if (bVar3) {
      std::ifstream::ifstream(&ifs1);
      std::ifstream::open((char *)&ifs1,(_Ios_Openmode)pcVar1);
      if ((abStack_2f8[*(long *)(_ifs1 + -0x18)] & 5) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs2);
        poVar8 = std::operator<<((ostream *)&ifs2,"Cannot open file ");
        std::operator<<(poVar8,pcVar1);
        std::__cxx11::string::string((string *)&error_message_10,"imglsadf",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs2);
        std::__cxx11::string::~string((string *)&error_message_10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs2);
        iVar7 = 1;
        goto LAB_0010434c;
      }
      input_stream = (istream *)&ifs2;
      std::ifstream::ifstream(input_stream);
      if ((pcVar11 != (char *)0x0) &&
         (std::ifstream::open((char *)&ifs2,(_Ios_Openmode)pcVar11),
         (abStack_500[*(long *)(_ifs2 + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
        poVar8 = std::operator<<((ostream *)&error_message_10,"Cannot open file ");
        std::operator<<(poVar8,pcVar11);
        std::__cxx11::string::string((string *)&buffer,"imglsadf",(allocator *)&preprocessing);
        sptk::PrintErrorMessage((string *)&buffer,(ostringstream *)&error_message_10);
        std::__cxx11::string::~string((string *)&buffer);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
        iVar7 = 1;
        goto LAB_0010433f;
      }
      cVar6 = std::__basic_file<char>::is_open();
      if (cVar6 == '\0') {
        input_stream = (istream *)&std::cin;
      }
      lVar9 = (long)num_filter_order;
      _GLOBAL__N_1::std::vector<double,_std::allocator<double>_>::vector
                (&filter_coefficients,lVar9 + 1U,(allocator_type *)&error_message_10);
      sptk::InputSourceFromStream::InputSourceFromStream
                (&input_source,false,(int)(lVar9 + 1U),(istream *)&ifs1);
      local_7f8 = 0.0;
      if (num_stage != 0) {
        local_7f8 = -1.0 / (double)num_stage;
      }
      local_838 = (char **)alpha;
      preprocessing.super_InputSourceInterface._vptr_InputSourceInterface =
           (_func_int **)&PTR__InputSourcePreprocessingForMelCepstrum_00113ae0;
      preprocessing.gamma_ = local_7f8;
      preprocessing.gain_flag_ = bVar10;
      preprocessing.source_ = &input_source.super_InputSourceInterface;
      iVar7 = (*input_source.super_InputSourceInterface._vptr_InputSourceInterface[2])
                        (&input_source);
      sptk::MelCepstrumToMlsaDigitalFilterCoefficients::MelCepstrumToMlsaDigitalFilterCoefficients
                (&preprocessing.mel_cepstrum_to_mlsa_digital_filter_coefficients_,iVar7 + -1,
                 (double)local_838);
      iVar7 = (*input_source.super_InputSourceInterface._vptr_InputSourceInterface[2])();
      sptk::GeneralizedCepstrumGainNormalization::GeneralizedCepstrumGainNormalization
                (&preprocessing.generalized_cepstrum_gain_normalization_,iVar7 + -1,local_7f8);
      preprocessing.is_valid_ = true;
      preprocessing.mel_cepstrum_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      preprocessing.mel_cepstrum_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      preprocessing.mel_cepstrum_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar7 = (*input_source.super_InputSourceInterface._vptr_InputSourceInterface[3])();
      if ((((char)iVar7 == '\0') ||
          (preprocessing.mel_cepstrum_to_mlsa_digital_filter_coefficients_.is_valid_ != true)) ||
         (preprocessing.generalized_cepstrum_gain_normalization_.is_valid_ == false)) {
        preprocessing.is_valid_ = false;
      }
      iVar7 = 1;
      sptk::InputSourceInterpolation::InputSourceInterpolation
                (&interpolation,frame_period,interpolation_period,true,
                 &preprocessing.super_InputSourceInterface);
      if (interpolation.is_valid_ == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
        std::operator<<((ostream *)&error_message_10,"Failed to initialize InputSource");
        std::__cxx11::string::string((string *)&buffer,"imglsadf",(allocator *)&filter);
        sptk::PrintErrorMessage((string *)&buffer,(ostringstream *)&error_message_10);
        std::__cxx11::string::~string((string *)&buffer);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
        goto LAB_0010431b;
      }
      sptk::InverseMglsaDigitalFilter::InverseMglsaDigitalFilter
                (&filter,num_filter_order,num_pade_order,num_stage,alpha,(bool)((byte)local_82c & 1)
                );
      buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00113b40;
      buffer.signals_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.signals_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      buffer.signals_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buffer.inverse_filter_coefficients_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.inverse_filter_coefficients_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      buffer.inverse_filter_coefficients_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buffer.mlsa_digital_filter_buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_00113b70;
      buffer.mlsa_digital_filter_buffer_.signals_for_basic_filter1_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      buffer.mlsa_digital_filter_buffer_.signals_for_basic_filter1_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      buffer.mlsa_digital_filter_buffer_.signals_for_basic_filter1_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      buffer.mlsa_digital_filter_buffer_.signals_for_basic_filter2_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      buffer.mlsa_digital_filter_buffer_.signals_for_basic_filter2_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      buffer.mlsa_digital_filter_buffer_.signals_for_basic_filter2_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      buffer.mlsa_digital_filter_buffer_.signals_for_exp_filter1_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      buffer.mlsa_digital_filter_buffer_.signals_for_exp_filter1_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      buffer.mlsa_digital_filter_buffer_.signals_for_exp_filter1_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      buffer.mlsa_digital_filter_buffer_.signals_for_exp_filter2_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      buffer.mlsa_digital_filter_buffer_.signals_for_exp_filter2_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      buffer.mlsa_digital_filter_buffer_.signals_for_exp_filter2_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (filter.is_valid_ == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
        std::operator<<((ostream *)&error_message_10,
                        "Failed to initialize InverseMglsaDigitalFilter");
        std::__cxx11::string::string((string *)&local_820,"imglsadf",(allocator *)&signal);
        sptk::PrintErrorMessage(&local_820,(ostringstream *)&error_message_10);
        goto LAB_001042e7;
      }
      goto LAB_001040ea;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs1);
    std::operator<<((ostream *)&ifs1,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&ifs2,"imglsadf",(allocator *)&error_message_10);
    sptk::PrintErrorMessage((string *)&ifs2,(ostringstream *)&ifs1);
  }
LAB_00103c29:
  std::__cxx11::string::~string((string *)&ifs2);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs1);
  return 1;
switchD_00103710_caseD_62:
  anon_unknown.dwarf_2f6d::PrintUsage((ostream *)&std::cerr);
  return 1;
  while( true ) {
    bVar3 = sptk::InverseMglsaDigitalFilter::Run(&filter,&filter_coefficients,&signal,&buffer);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
      std::operator<<((ostream *)&error_message_10,"Failed to apply inverse MGLSA digital filter");
      std::__cxx11::string::string((string *)&local_820,"imglsadf",&local_84d);
      sptk::PrintErrorMessage(&local_820,(ostringstream *)&error_message_10);
      goto LAB_001042e7;
    }
    bVar3 = sptk::WriteStream<double>(signal,(ostream *)&std::cout);
    if (!bVar3) break;
LAB_001040ea:
    bVar3 = sptk::ReadStream<double>(&signal,input_stream);
    if (!bVar3) {
      iVar7 = 0;
      goto LAB_00104301;
    }
    bVar3 = sptk::InputSourceInterpolation::Get
                      (&interpolation,
                       (vector<double,_std::allocator<double>_> *)&filter_coefficients);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
      std::operator<<((ostream *)&error_message_10,"Cannot get filter coefficients");
      std::__cxx11::string::string((string *)&local_820,"imglsadf",&local_84d);
      sptk::PrintErrorMessage(&local_820,(ostringstream *)&error_message_10);
      goto LAB_001042e7;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
  std::operator<<((ostream *)&error_message_10,"Failed to write a filter output");
  std::__cxx11::string::string((string *)&local_820,"imglsadf",&local_84d);
  sptk::PrintErrorMessage(&local_820,(ostringstream *)&error_message_10);
LAB_001042e7:
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
  iVar7 = 1;
LAB_00104301:
  sptk::InverseMglsaDigitalFilter::Buffer::~Buffer(&buffer);
  sptk::InverseMglsaDigitalFilter::~InverseMglsaDigitalFilter(&filter);
LAB_0010431b:
  sptk::InputSourceInterpolation::~InputSourceInterpolation(&interpolation);
  anon_unknown.dwarf_2f6d::InputSourcePreprocessingForMelCepstrum::
  ~InputSourcePreprocessingForMelCepstrum(&preprocessing);
  _GLOBAL__N_1::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&filter_coefficients.super__Vector_base<double,_std::allocator<double>_>);
LAB_0010433f:
  std::ifstream::~ifstream(&ifs2);
LAB_0010434c:
  std::ifstream::~ifstream(&ifs1);
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_filter_order(kDefaultNumFilterOrder);
  double alpha(kDefaultAlpha);
  int num_stage(kDefaultNumStage);
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  int num_pade_order(kDefaultNumPadeOrder);
  bool transposition_flag(kDefaultTranspositionFlag);
  bool gain_flag(kDefaultGainFlag);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "m:a:c:p:i:P:tkh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &alpha) ||
            !sptk::IsValidAlpha(alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &num_stage) ||
            num_stage < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -c option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 'P': {
        const int min(4);
        const int max(7);
        if (!sptk::ConvertStringToInteger(optarg, &num_pade_order) ||
            !sptk::IsInRange(num_pade_order, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -P option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("imglsadf", error_message);
          return 1;
        }
        break;
      }
      case 't': {
        transposition_flag = true;
        break;
      }
      case 'k': {
        gain_flag = false;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  // Get input file names.
  const char* filter_coefficients_file;
  const char* filter_input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    filter_coefficients_file = argv[argc - 2];
    filter_input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    filter_coefficients_file = argv[argc - 1];
    filter_input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, mgcfile and infile, are required";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  // Open stream for reading filter coefficients.
  std::ifstream ifs1;
  ifs1.open(filter_coefficients_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << filter_coefficients_file;
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }
  std::istream& stream_for_filter_coefficients(ifs1);

  // Open stream for reading input signals.
  std::ifstream ifs2;
  if (NULL != filter_input_file) {
    ifs2.open(filter_input_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << filter_input_file;
      sptk::PrintErrorMessage("imglsadf", error_message);
      return 1;
    }
  }
  std::istream& stream_for_filter_input(ifs2.is_open() ? ifs2 : std::cin);

  // Prepare variables for filtering.
  const int filter_length(num_filter_order + 1);
  std::vector<double> filter_coefficients(filter_length);
  sptk::InputSourceFromStream input_source(false, filter_length,
                                           &stream_for_filter_coefficients);
  const double gamma((0 == num_stage) ? 0.0 : -1.0 / num_stage);
  InputSourcePreprocessingForMelCepstrum preprocessing(alpha, gamma, gain_flag,
                                                       &input_source);
  sptk::InputSourceInterpolation interpolation(
      frame_period, interpolation_period, true, &preprocessing);
  if (!interpolation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSource";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  sptk::InverseMglsaDigitalFilter filter(num_filter_order, num_pade_order,
                                         num_stage, alpha, transposition_flag);
  sptk::InverseMglsaDigitalFilter::Buffer buffer;
  if (!filter.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InverseMglsaDigitalFilter";
    sptk::PrintErrorMessage("imglsadf", error_message);
    return 1;
  }

  double signal;

  while (sptk::ReadStream(&signal, &stream_for_filter_input)) {
    if (!interpolation.Get(&filter_coefficients)) {
      std::ostringstream error_message;
      error_message << "Cannot get filter coefficients";
      sptk::PrintErrorMessage("imglsadf", error_message);
      return 1;
    }

    if (!filter.Run(filter_coefficients, &signal, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to apply inverse MGLSA digital filter";
      sptk::PrintErrorMessage("imglsadf", error_message);
      return 1;
    }

    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a filter output";
      sptk::PrintErrorMessage("imglsadf", error_message);
      return 1;
    }
  }

  return 0;
}